

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall WriterTest_WriteWideString_Test::TestBody(WriterTest_WriteWideString_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *__s1;
  bool bVar1;
  int iVar2;
  AssertionResult *pAVar3;
  char *message;
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> actual;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> expected;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> os;
  AssertionResult local_a08;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_9f8;
  char *local_9d8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_9d0;
  undefined1 *local_9b0 [2];
  undefined1 local_9a0 [16];
  AssertionResult local_990 [7];
  ios_base local_920 [264];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_818;
  wchar_t *local_810;
  undefined8 local_808;
  undefined8 local_800;
  wchar_t local_7f8 [500];
  
  local_9d8 = "char";
  local_818.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  __s1 = &local_9f8.field_2;
  local_800 = 500;
  local_808 = 3;
  local_7f8[0] = L'a';
  local_7f8[1] = L'b';
  local_7f8[2] = 99;
  local_9f8._M_dataplus._M_p = (pointer)__s1;
  local_810 = local_7f8;
  if (local_7f8 == (wchar_t *)0x0) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  wmemcpy(__s1->_M_local_buf,local_7f8,3);
  local_9f8._M_string_length = 3;
  local_9f8._M_dataplus._M_p[3] = L'\0';
  local_9d0._M_string_length = 0;
  local_9d0.field_2._M_local_buf[0] = L'\0';
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_990);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)local_990,L"abc",3);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wstring::operator=((wstring *)&local_9d0,(wstring *)local_9b0);
  if (local_9b0[0] != local_9a0) {
    operator_delete(local_9b0[0]);
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_990);
  std::ios_base::~ios_base(local_920);
  if (local_9d0._M_string_length == local_9f8._M_string_length) {
    if (local_9d0._M_string_length != 0) {
      iVar2 = wmemcmp(local_9d0._M_dataplus._M_p,local_9f8._M_dataplus._M_p,
                      local_9d0._M_string_length);
      if (iVar2 != 0) goto LAB_00125016;
    }
    testing::AssertionSuccess();
  }
  else {
LAB_00125016:
    testing::AssertionFailure();
    pAVar3 = testing::AssertionResult::operator<<(local_990,(char (*) [19])"Value of: (Writer<");
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_9d8);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [21])">() << value).str()\n");
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x24a059);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_9f8);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x24a728);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x24a065);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_9d0);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x24a728);
    testing::AssertionResult::AssertionResult(&local_a08,pAVar3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_990[0].message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_9f8._M_dataplus._M_p != __s1) {
    operator_delete(local_9f8._M_dataplus._M_p);
  }
  local_818.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  if (local_810 != local_7f8) {
    operator_delete(local_810);
  }
  if (local_a08.success_ == false) {
    testing::Message::Message((Message *)&local_818);
    if (local_a08.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_a08.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x2b9,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_990,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_990);
    if (local_818.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_818.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_818.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a08.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(WriterTest, WriteWideString) {
  CHECK_WRITE_WCHAR(L"abc");
  // The following line shouldn't compile:
  //std::declval<fmt::basic_writer<fmt::wbuffer>>().write("abc");
}